

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::writeAll(Assembler *this)

{
  char *pcVar1;
  pointer pvVar2;
  int iVar3;
  type_info *ptVar4;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  pointer pvVar8;
  string *psVar9;
  pointer pIVar10;
  ulong uVar11;
  Assembler *pAVar12;
  pointer paVar13;
  long lVar14;
  ulong uVar15;
  pointer pIVar16;
  string function_name;
  char local_79;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  Instruction *local_50;
  pointer local_48;
  Instruction local_40;
  
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".constants:",0xb);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  paVar13 = (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar13) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      ptVar4 = std::any::type((any *)((long)&paVar13->_M_manager + lVar14));
      pcVar1 = *(char **)(ptVar4 + 8);
      if (pcVar1 == _put) {
LAB_00118ba6:
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tI\t",3);
        piVar7 = (int *)std::__any_caster<int>
                                  ((any *)((long)&((this->_consts).
                                                                                                      
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar14));
        if (piVar7 == (int *)0x0) goto LAB_00118ff7;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*piVar7);
        local_78[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
      }
      else {
        if (*pcVar1 != '*') {
          iVar3 = strcmp(pcVar1,_put);
          if (iVar3 == 0) goto LAB_00118ba6;
        }
        ptVar4 = std::any::type((any *)((long)&((this->_consts).
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_manager + lVar14));
        pcVar1 = *(char **)(ptVar4 + 8);
        if (pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
          if (*pcVar1 == '*') {
LAB_00118ffc:
            psVar9 = (string *)__cxa_allocate_exception(0x28);
            local_50 = &local_40;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unvalid typeid","")
            ;
            *(string **)psVar9 = psVar9 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      (psVar9,local_50,(long)&local_50->_opr + (long)&local_48->_opr);
            *(undefined8 *)(psVar9 + 0x20) = 0;
            __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
          }
          iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
          if (iVar3 != 0) goto LAB_00118ffc;
        }
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tS\t\"",4);
        plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                   ((any *)((long)&((this->_consts).
                                                                                                        
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar14));
        if (plVar6 == (long *)0x0) goto LAB_00118ff7;
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_78._0_8_,local_78._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
        }
      }
      uVar15 = uVar15 + 1;
      paVar13 = (this->_consts).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_consts).
                                    super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)paVar13 >> 4));
  }
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".start:",7);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  if ((this->_startInstructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->_startInstructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar15);
      local_78[0] = 9;
      pAVar12 = (Assembler *)local_78;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
      instructionToAssembly_abi_cxx11_
                ((string *)local_78,pAVar12,
                 (Instruction *)
                 ((long)&((this->_startInstructions).
                          super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_start)->_opr + lVar14));
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_78._0_8_,local_78._8_8_);
      local_79 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_startInstructions).
                                    super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_startInstructions).
                                    super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  poVar5 = this->_wtr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".functions:",0xb);
  local_78[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,1);
  if ((this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_instructions).
      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar15 = 0;
    do {
      plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                 ((this->_consts).
                                  super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (this->_functionNameConstant).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar15]);
      if (plVar6 == (long *)0x0) goto LAB_00118ff7;
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar15);
      local_79 = '\t';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar5,
                          (this->_functionNameConstant).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15]);
      local_79 = '\t';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::operator[](&this->_functionParameter,(key_type *)local_78);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t1\n",3);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
      }
      uVar15 = uVar15 + 1;
      pvVar8 = (this->_instructions).
               super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (this->_instructions).
               super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = ((long)pvVar2 - (long)pvVar8 >> 3) * -0x5555555555555555;
    } while (uVar15 <= uVar11 && uVar11 - uVar15 != 0);
    if (pvVar2 != pvVar8) {
      pIVar16 = (pointer)0x0;
      do {
        poVar5 = this->_wtr;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".F",2);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)pIVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\t#",3);
        plVar6 = (long *)std::__any_caster<std::__cxx11::string>
                                   ((this->_consts).
                                    super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (this->_functionNameConstant).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[(long)pIVar16]);
        if (plVar6 == (long *)0x0) {
LAB_00118ff7:
          std::__throw_bad_any_cast();
        }
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar6,plVar6[1] + *plVar6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_78._0_8_,local_78._8_8_);
        local_79 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
        if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
        }
        pvVar8 = (this->_instructions).
                 super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58 = pIVar16;
        if (*(pointer *)
             ((long)&pvVar8[(long)pIVar16].
                     super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                     super__Vector_impl_data + 8) !=
            pvVar8[(long)pIVar16].super__Vector_base<Instruction,_std::allocator<Instruction>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar14 = 0;
          uVar15 = 0;
          do {
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)this->_wtr,(int)uVar15);
            local_78[0] = 9;
            pAVar12 = (Assembler *)local_78;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_78,1);
            instructionToAssembly_abi_cxx11_
                      ((string *)local_78,pAVar12,
                       (Instruction *)
                       (*(long *)&(this->_instructions).
                                  super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)pIVar16].
                                  super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                  _M_impl.super__Vector_impl_data + lVar14));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_78._0_8_,local_78._8_8_);
            local_79 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_79,1);
            if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
              operator_delete((void *)local_78._0_8_,(ulong)(local_68._M_allocated_capacity + 1));
            }
            pvVar8 = (this->_instructions).
                     super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar15 = uVar15 + 1;
            lVar14 = lVar14 + 0x10;
          } while (uVar15 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar8[(long)pIVar16].
                                                                                                      
                                                  super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    *(long *)&pvVar8[(long)pIVar16].
                                              super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                              ._M_impl.super__Vector_impl_data >> 4));
        }
        pIVar16 = (pointer)((long)&local_58->_opr + 1);
        pIVar10 = (pointer)(((long)(this->_instructions).
                                   super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                           -0x5555555555555555);
      } while (pIVar16 <= pIVar10 && (long)pIVar10 - (long)pIVar16 != 0);
    }
  }
  return;
}

Assistant:

void Assembler::writeAll() {
	//const
	_wtr << ".constants:" << '\n';
	for (int i = 0; i < _consts.size(); i++) {
		if (_consts[i].type() == typeid(int)) {
			_wtr << i << "\tI\t" << std::any_cast<int>(_consts[i]) << '\n';
		}
		else if (_consts[i].type() == typeid(std::string)) {
			_wtr << i << "\tS\t\"" << std::any_cast<std::string>(_consts[i]) << "\"\n";
		}
		else {
			throw Error("Unvalid typeid");
		}
	}
	//start code
	_wtr << ".start:" << '\n';
	for (int i = 0; i < _startInstructions.size(); i++) {
		_wtr << i << '\t' << instructionToAssembly(_startInstructions[i]) << '\n';
	}
	//function table
	_wtr << ".functions:" << '\n';
	for (int i = 0; i < _instructions.size(); i++) {
		std::string function_name = std::any_cast<std::string>(_consts[_functionNameConstant[i]]);
		_wtr << i << '\t' << _functionNameConstant[i] << '\t' << _functionParameter[function_name].size() << "\t1\n";
	}
	//function instructions table
	for (int i = 0; i < _instructions.size(); i++) {
		_wtr << ".F" << i << ":\t#" << std::any_cast<std::string>(_consts[_functionNameConstant[i]]) << '\n';
		for (int j = 0; j < _instructions[i].size(); j++) {
			_wtr << j << '\t' << instructionToAssembly(_instructions[i][j]) << '\n';
		}
	}
}